

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlAttribute::Print
          (TiXmlAttribute *this,FILE *cfile,int param_2,TiXmlString *str)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  TiXmlString local_38;
  TiXmlString v;
  TiXmlString n;
  TiXmlString *str_local;
  int param_2_local;
  FILE *cfile_local;
  TiXmlAttribute *this_local;
  
  TiXmlString::TiXmlString(&v);
  TiXmlString::TiXmlString(&local_38);
  TiXmlBase::EncodeString(&this->name,&v);
  TiXmlBase::EncodeString(&this->value,&local_38);
  sVar1 = TiXmlString::find(&this->value,'\"');
  if (sVar1 == 0xffffffffffffffff) {
    if (cfile != (FILE *)0x0) {
      pcVar2 = TiXmlString::c_str(&v);
      pcVar3 = TiXmlString::c_str(&local_38);
      fprintf((FILE *)cfile,"%s=\"%s\"",pcVar2,pcVar3);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::operator+=(str,&v);
      TiXmlString::operator+=(str,"=\"");
      TiXmlString::operator+=(str,&local_38);
      TiXmlString::operator+=(str,"\"");
    }
  }
  else {
    if (cfile != (FILE *)0x0) {
      pcVar2 = TiXmlString::c_str(&v);
      pcVar3 = TiXmlString::c_str(&local_38);
      fprintf((FILE *)cfile,"%s=\'%s\'",pcVar2,pcVar3);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::operator+=(str,&v);
      TiXmlString::operator+=(str,"=\'");
      TiXmlString::operator+=(str,&local_38);
      TiXmlString::operator+=(str,"\'");
    }
  }
  TiXmlString::~TiXmlString(&local_38);
  TiXmlString::~TiXmlString(&v);
  return;
}

Assistant:

void TiXmlAttribute::Print(FILE* cfile, int /*depth*/,
	TIXML_STRING* str) const {
	TIXML_STRING n, v;

	EncodeString(name, &n);
	EncodeString(value, &v);

	if (value.find('\"') == TIXML_STRING::npos) {
		if (cfile) {
			fprintf(cfile, "%s=\"%s\"", n.c_str(), v.c_str());
		}
		if (str) {
			(*str) += n;
			(*str) += "=\"";
			(*str) += v;
			(*str) += "\"";
		}
	} else {
		if (cfile) {
			fprintf(cfile, "%s='%s'", n.c_str(), v.c_str());
		}
		if (str) {
			(*str) += n;
			(*str) += "='";
			(*str) += v;
			(*str) += "'";
		}
	}
}